

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

int raw_find_str(memptr *raw_value,char *str)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int local_34;
  int i;
  char *ptr;
  char c;
  char *str_local;
  memptr *raw_value_local;
  
  cVar1 = raw_value->buf[raw_value->length];
  for (local_34 = 0; raw_value->buf[local_34] != '\0'; local_34 = local_34 + 1) {
    iVar2 = tolower((int)raw_value->buf[local_34]);
    raw_value->buf[local_34] = (char)iVar2;
  }
  raw_value->buf[raw_value->length] = '\0';
  pcVar3 = strstr(raw_value->buf,str);
  raw_value->buf[raw_value->length] = cVar1;
  if (pcVar3 == (char *)0x0) {
    raw_value_local._4_4_ = -1;
  }
  else {
    raw_value_local._4_4_ = (int)pcVar3 - (int)raw_value->buf;
  }
  return raw_value_local._4_4_;
}

Assistant:

int raw_find_str(memptr *raw_value, const char *str)
{
	char c;
	char *ptr;
	int i = 0;

	/* save */
	c = raw_value->buf[raw_value->length];

	/* Make it lowercase */
	for (i = 0; raw_value->buf[i]; ++i) {
		raw_value->buf[i] = (char)tolower(raw_value->buf[i]);
	}

	/* null-terminate */
	raw_value->buf[raw_value->length] = 0;

	/* Find the substring position */
	ptr = strstr(raw_value->buf, str);

	/* restore the "length" byte */
	raw_value->buf[raw_value->length] = c;

	if (ptr == 0) {
		return -1;
	}

	/* return index */
	return (int)(ptr - raw_value->buf);
}